

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrss.c
# Opt level: O0

size_t getCurrentRSS(void)

{
  FILE *pFVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  FILE *fp;
  long rss;
  
  fp = (FILE *)0x0;
  __stream = fopen("/proc/self/statm","r");
  if (__stream == (FILE *)0x0) {
    rss = 0;
  }
  else {
    iVar2 = __isoc99_fscanf(__stream,"%*s%ld",&fp);
    if (iVar2 == 1) {
      fclose(__stream);
      pFVar1 = fp;
      lVar3 = sysconf(0x1e);
      rss = (long)pFVar1 * lVar3;
    }
    else {
      fclose(__stream);
      rss = 0;
    }
  }
  return rss;
}

Assistant:

size_t
getCurrentRSS()
{
#if defined(__APPLE__) && defined(__MACH__)
    /* OSX ------------------------------------------------------ */
    struct mach_task_basic_info info;
    mach_msg_type_number_t infoCount = MACH_TASK_BASIC_INFO_COUNT;
    if (task_info(mach_task_self(), MACH_TASK_BASIC_INFO, (task_info_t)&info, &infoCount) != KERN_SUCCESS)
        return (size_t)0L;      /* Can't access? */
    return (size_t)info.resident_size;
#elif defined(_WIN32)
	/* Windows -------------------------------------------------- */
	PROCESS_MEMORY_COUNTERS info;
	GetProcessMemoryInfo( GetCurrentProcess( ), &info, sizeof(info) );
	return (size_t)info.WorkingSetSize;
#else
    /* Linux ---------------------------------------------------- */
    long rss = 0L;
    FILE *fp = NULL;
    if ((fp = fopen("/proc/self/statm", "r")) == NULL)
        return (size_t)0L;      /* Can't open? */
    if (fscanf(fp, "%*s%ld", &rss) != 1) {
        fclose(fp);
        return (size_t)0L;      /* Can't read? */
    }
    fclose(fp);
    return (size_t)rss * (size_t)sysconf(_SC_PAGESIZE);
#endif
}